

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSolutionDebug.cpp
# Opt level: O3

HighsDebugStatus
debugCompareHighsInfoInfeasibility
          (HighsOptions *options,HighsInfo *highs_info0,HighsInfo *highs_info1)

{
  HighsDebugStatus HVar1;
  HighsDebugStatus HVar2;
  uint uVar3;
  undefined1 *local_f0 [2];
  undefined1 local_e0 [16];
  undefined1 *local_d0 [2];
  undefined1 local_c0 [16];
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_d0[0] = local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"num_primal_infeasibility","");
  HVar1 = kOk;
  uVar3 = (highs_info1->super_HighsInfoStruct).num_primal_infeasibilities -
          (highs_info0->super_HighsInfoStruct).num_primal_infeasibilities;
  if (uVar3 != 0) {
    HVar1 = kLogicalError;
    highsLogDev(&(options->super_HighsOptionsStruct).log_options,kError,
                "SolutionPar:  difference of %d for %s\n",(ulong)uVar3,local_d0[0]);
  }
  HVar1 = debugWorseStatus(HVar1,kOk);
  if (local_d0[0] != local_c0) {
    operator_delete(local_d0[0]);
  }
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"sum_primal_infeasibility","")
  ;
  HVar2 = debugCompareHighsInfoDouble
                    (&local_50,options,
                     (highs_info0->super_HighsInfoStruct).sum_primal_infeasibilities,
                     (highs_info1->super_HighsInfoStruct).sum_primal_infeasibilities);
  HVar1 = debugWorseStatus(HVar2,HVar1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"max_primal_infeasibility","")
  ;
  HVar2 = debugCompareHighsInfoDouble
                    (&local_70,options,(highs_info0->super_HighsInfoStruct).max_primal_infeasibility
                     ,(highs_info1->super_HighsInfoStruct).max_primal_infeasibility);
  HVar1 = debugWorseStatus(HVar2,HVar1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  local_f0[0] = local_e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"num_dual_infeasibility","");
  HVar2 = kOk;
  uVar3 = (highs_info1->super_HighsInfoStruct).num_dual_infeasibilities -
          (highs_info0->super_HighsInfoStruct).num_dual_infeasibilities;
  if (uVar3 != 0) {
    HVar2 = kLogicalError;
    highsLogDev(&(options->super_HighsOptionsStruct).log_options,kError,
                "SolutionPar:  difference of %d for %s\n",(ulong)uVar3,local_f0[0]);
  }
  HVar1 = debugWorseStatus(HVar2,HVar1);
  if (local_f0[0] != local_e0) {
    operator_delete(local_f0[0]);
  }
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"sum_dual_infeasibility","");
  HVar2 = debugCompareHighsInfoDouble
                    (&local_90,options,(highs_info0->super_HighsInfoStruct).sum_dual_infeasibilities
                     ,(highs_info1->super_HighsInfoStruct).sum_dual_infeasibilities);
  HVar1 = debugWorseStatus(HVar2,HVar1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"max_dual_infeasibility","");
  HVar2 = debugCompareHighsInfoDouble
                    (&local_b0,options,(highs_info0->super_HighsInfoStruct).max_dual_infeasibility,
                     (highs_info1->super_HighsInfoStruct).max_dual_infeasibility);
  HVar1 = debugWorseStatus(HVar2,HVar1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  return HVar1;
}

Assistant:

HighsDebugStatus debugCompareHighsInfoInfeasibility(
    const HighsOptions& options, const HighsInfo& highs_info0,
    const HighsInfo& highs_info1) {
  HighsDebugStatus return_status = HighsDebugStatus::kOk;
  return_status = debugWorseStatus(
      debugCompareHighsInfoInteger("num_primal_infeasibility", options,
                                   highs_info0.num_primal_infeasibilities,
                                   highs_info1.num_primal_infeasibilities),
      return_status);
  return_status = debugWorseStatus(
      debugCompareHighsInfoDouble("sum_primal_infeasibility", options,
                                  highs_info0.sum_primal_infeasibilities,
                                  highs_info1.sum_primal_infeasibilities),
      return_status);
  return_status = debugWorseStatus(
      debugCompareHighsInfoDouble("max_primal_infeasibility", options,
                                  highs_info0.max_primal_infeasibility,
                                  highs_info1.max_primal_infeasibility),
      return_status);

  return_status = debugWorseStatus(
      debugCompareHighsInfoInteger("num_dual_infeasibility", options,
                                   highs_info0.num_dual_infeasibilities,
                                   highs_info1.num_dual_infeasibilities),
      return_status);
  return_status = debugWorseStatus(
      debugCompareHighsInfoDouble("sum_dual_infeasibility", options,
                                  highs_info0.sum_dual_infeasibilities,
                                  highs_info1.sum_dual_infeasibilities),
      return_status);
  return_status = debugWorseStatus(
      debugCompareHighsInfoDouble("max_dual_infeasibility", options,
                                  highs_info0.max_dual_infeasibility,
                                  highs_info1.max_dual_infeasibility),
      return_status);
  return return_status;
}